

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O0

void __thiscall Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(Operator *this,OPL3 *OPL3)

{
  uint uVar1;
  int am1_vib1_egt1_ksr1_mult4;
  OPL3 *OPL3_local;
  Operator *this_local;
  
  uVar1 = (uint)OPL3->registers[this->operatorBaseAddress + 0x20];
  this->am = (int)(uVar1 & 0x80) >> 7;
  this->vib = (int)(uVar1 & 0x40) >> 6;
  this->egt = (int)(uVar1 & 0x20) >> 5;
  this->ksr = (int)(uVar1 & 0x10) >> 4;
  this->mult = uVar1 & 0xf;
  PhaseGenerator::setFrequency(&this->phaseGenerator,this->f_number,this->block,this->mult);
  EnvelopeGenerator::setActualAttackRate
            (&this->envelopeGenerator,this->ar,this->ksr,this->keyScaleNumber);
  EnvelopeGenerator::setActualDecayRate
            (&this->envelopeGenerator,this->dr,this->ksr,this->keyScaleNumber);
  EnvelopeGenerator::setActualReleaseRate
            (&this->envelopeGenerator,this->rr,this->ksr,this->keyScaleNumber);
  return;
}

Assistant:

void Operator::update_AM1_VIB1_EGT1_KSR1_MULT4(OPL3 *OPL3) {
	
	int am1_vib1_egt1_ksr1_mult4 = OPL3->registers[operatorBaseAddress+OperatorDataStruct::AM1_VIB1_EGT1_KSR1_MULT4_Offset];
	
	// Amplitude Modulation. This register is used int EnvelopeGenerator.getEnvelope();
	am  = (am1_vib1_egt1_ksr1_mult4 & 0x80) >> 7;
	// Vibrato. This register is used in PhaseGenerator.getPhase();
	vib = (am1_vib1_egt1_ksr1_mult4 & 0x40) >> 6;
	// Envelope Generator Type. This register is used in EnvelopeGenerator.getEnvelope();
	egt = (am1_vib1_egt1_ksr1_mult4 & 0x20) >> 5;
	// Key Scale Rate. Sets the actual envelope rate together with rate and keyScaleNumber.
	// This register os used in EnvelopeGenerator.setActualAttackRate().
	ksr = (am1_vib1_egt1_ksr1_mult4 & 0x10) >> 4;
	// Multiple. Multiplies the Channel.baseFrequency to get the Operator.operatorFrequency.
	// This register is used in PhaseGenerator.setFrequency().
	mult = am1_vib1_egt1_ksr1_mult4 & 0x0F;
	
	phaseGenerator.setFrequency(f_number, block, mult);
	envelopeGenerator.setActualAttackRate(ar, ksr, keyScaleNumber);
	envelopeGenerator.setActualDecayRate(dr, ksr, keyScaleNumber); 
	envelopeGenerator.setActualReleaseRate(rr, ksr, keyScaleNumber);
}